

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Set_Record_R_PDU.cpp
# Opt level: O0

void __thiscall KDIS::PDU::Set_Record_R_PDU::Encode(Set_Record_R_PDU *this,KDataStream *stream)

{
  bool bVar1;
  KDataStream *pKVar2;
  pointer pRVar3;
  KDataStream local_50;
  __normal_iterator<const_KDIS::DATA_TYPE::RecordSet_*,_std::vector<KDIS::DATA_TYPE::RecordSet,_std::allocator<KDIS::DATA_TYPE::RecordSet>_>_>
  local_28;
  const_iterator citrEnd;
  const_iterator citr;
  KDataStream *stream_local;
  Set_Record_R_PDU *this_local;
  
  Simulation_Management_Header::Encode(&this->super_Simulation_Management_Header,stream);
  pKVar2 = KDataStream::operator<<(stream,this->m_ui32RqId);
  pKVar2 = KDataStream::operator<<(pKVar2,(this->super_Reliability_Header).m_ui8ReqRelSrv);
  pKVar2 = KDataStream::operator<<(pKVar2,this->m_ui8Padding1);
  pKVar2 = KDataStream::operator<<(pKVar2,this->m_ui16Padding);
  pKVar2 = KDataStream::operator<<(pKVar2,this->m_ui32Padding);
  KDataStream::operator<<(pKVar2,this->m_ui32NumRecSets);
  citrEnd = std::vector<KDIS::DATA_TYPE::RecordSet,_std::allocator<KDIS::DATA_TYPE::RecordSet>_>::
            begin(&this->m_vRecs);
  local_28._M_current =
       (RecordSet *)
       std::vector<KDIS::DATA_TYPE::RecordSet,_std::allocator<KDIS::DATA_TYPE::RecordSet>_>::end
                 (&this->m_vRecs);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=(&citrEnd,&local_28);
    if (!bVar1) break;
    pRVar3 = __gnu_cxx::
             __normal_iterator<const_KDIS::DATA_TYPE::RecordSet_*,_std::vector<KDIS::DATA_TYPE::RecordSet,_std::allocator<KDIS::DATA_TYPE::RecordSet>_>_>
             ::operator->(&citrEnd);
    (*(pRVar3->super_DataTypeBase)._vptr_DataTypeBase[4])();
    KDataStream::operator<<(stream,&local_50);
    KDataStream::~KDataStream(&local_50);
    __gnu_cxx::
    __normal_iterator<const_KDIS::DATA_TYPE::RecordSet_*,_std::vector<KDIS::DATA_TYPE::RecordSet,_std::allocator<KDIS::DATA_TYPE::RecordSet>_>_>
    ::operator++(&citrEnd);
  }
  return;
}

Assistant:

void Set_Record_R_PDU::Encode( KDataStream & stream ) const
{
    Simulation_Management_Header::Encode( stream );

    stream << m_ui32RqId
           << m_ui8ReqRelSrv
           << m_ui8Padding1
           << m_ui16Padding
           << m_ui32Padding
           << m_ui32NumRecSets;

    vector<RecordSet>::const_iterator citr = m_vRecs.begin();
    vector<RecordSet>::const_iterator citrEnd = m_vRecs.end();

    for( ; citr != citrEnd; ++citr )
    {
        stream << citr->Encode();
    }
}